

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::generateDummyNormalBlocks
               (deUint8 *dst,size_t numBlocks,int blockWidth,int blockHeight)

{
  AssignBlock128 local_c90;
  int local_c7c;
  ulong uStack_c78;
  int weightNdx;
  size_t blockNdx;
  int local_c68;
  int weightRangeMax;
  int numWeights;
  NormalBlockISEInputs iseInputs;
  undefined1 local_54 [8];
  NormalBlockParams blockParams;
  int blockHeight_local;
  int blockWidth_local;
  size_t numBlocks_local;
  deUint8 *dst_local;
  
  blockParams._44_4_ = blockHeight;
  blockParams.partitionSeed = blockWidth;
  anon_unknown_0::NormalBlockParams::NormalBlockParams((NormalBlockParams *)local_54);
  local_54._0_4_ = 3;
  local_54._4_4_ = 3;
  anon_unknown_0::ISEParams::ISEParams
            ((ISEParams *)((long)&iseInputs.endpoint.value + 0x5f8),ISEMODE_PLAIN_BIT,5);
  blockParams.weightGridWidth = iseInputs.endpoint.value._1528_4_;
  blockParams.weightGridHeight = iseInputs.endpoint.value._1532_4_;
  blockParams.weightISEParams.mode._0_1_ = ISEMODE_TRIT;
  blockParams.isDualPlane = true;
  blockParams._17_3_ = 0;
  blockParams.ccs = 8;
  anon_unknown_0::generateDefaultISEInputs
            ((NormalBlockISEInputs *)&weightRangeMax,(NormalBlockParams *)local_54);
  weightRangeMax._0_1_ = 0;
  local_c68 = anon_unknown_0::computeNumWeights((NormalBlockParams *)local_54);
  blockNdx._4_4_ = anon_unknown_0::computeISERangeMax((ISEParams *)&blockParams);
  for (uStack_c78 = 0; uStack_c78 < numBlocks; uStack_c78 = uStack_c78 + 1) {
    for (local_c7c = 0; local_c7c < local_c68; local_c7c = local_c7c + 1) {
      (&numWeights)[local_c7c] =
           (int)(((uStack_c78 * (long)local_c68 + (long)local_c7c) * (long)(int)blockNdx._4_4_) /
                (numBlocks * (long)local_c68 - 1));
    }
    local_c90 = anon_unknown_0::generateNormalBlock
                          ((NormalBlockParams *)local_54,blockParams.partitionSeed,
                           blockParams._44_4_,(NormalBlockISEInputs *)&weightRangeMax);
    anon_unknown_0::AssignBlock128::assignToMemory(&local_c90,dst + uStack_c78 * 0x10);
  }
  return;
}

Assistant:

void generateDummyNormalBlocks (deUint8* dst, size_t numBlocks, int blockWidth, int blockHeight)
{
	NormalBlockParams blockParams;

	blockParams.weightGridWidth			= 3;
	blockParams.weightGridHeight		= 3;
	blockParams.weightISEParams			= ISEParams(ISEMODE_PLAIN_BIT, 5);
	blockParams.isDualPlane				= false;
	blockParams.numPartitions			= 1;
	blockParams.colorEndpointModes[0]	= 8;

	NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
	iseInputs.weight.isGivenInBlockForm = false;

	const int numWeights		= computeNumWeights(blockParams);
	const int weightRangeMax	= computeISERangeMax(blockParams.weightISEParams);

	for (size_t blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
			iseInputs.weight.value.plain[weightNdx] = (deUint32)((blockNdx*numWeights + weightNdx) * weightRangeMax / (numBlocks*numWeights-1));

		generateNormalBlock(blockParams, blockWidth, blockHeight, iseInputs).assignToMemory(dst + blockNdx*BLOCK_SIZE_BYTES);
	}
}